

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotDigitalEx<ImPlot::GetterXsYs<signed_char>>
               (char *label_id,GetterXsYs<signed_char> getter)

{
  float fVar1;
  float fVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  bool bVar5;
  ImU32 col;
  ImDrawList *pIVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ImVec2 IVar13;
  float fVar14;
  ImVec2 pMax;
  ImPlotPoint itemData1;
  ImVec2 local_a8;
  ImVec2 local_a0;
  int local_94;
  ImPlotContext *local_90;
  ImPlotPoint local_88;
  ImPlotPoint local_78;
  int local_64;
  ImRect *local_60;
  ImVec4 *local_58;
  ImDrawList *local_50;
  ulong local_48;
  ImPlotContext *local_40;
  ulong local_38;
  
  bVar5 = BeginItem(label_id,1);
  if (bVar5) {
    local_90 = GImPlot;
    pIVar6 = GetPlotDrawList();
    if ((1 < getter.Count) && ((GImPlot->NextItemData).RenderFill == true)) {
      uVar10 = (ulong)(uint)getter.Offset;
      lVar12 = (long)getter.Stride;
      lVar7 = ((getter.Offset % getter.Count + getter.Count) % getter.Count) * lVar12;
      local_78.x = (double)(int)getter.Xs[lVar7];
      local_78.y = (double)(int)getter.Ys[lVar7];
      local_60 = local_90->PixelRange + GImPlot->CurrentPlot->CurrentYAxis;
      local_40 = GImPlot;
      local_58 = (GImPlot->NextItemData).Colors + 1;
      local_38 = (ulong)(getter.Offset + 1);
      iVar8 = 0;
      iVar11 = 0;
      local_50 = pIVar6;
      local_48 = uVar10;
      do {
        lVar7 = (((iVar11 + (int)uVar10) % getter.Count + getter.Count) % getter.Count) * lVar12;
        local_88.x = (double)(int)getter.Xs[lVar7];
        local_88.y = (double)(int)getter.Ys[lVar7];
        if ((ulong)ABS(local_78.y) < 0x7ff0000000000000) {
          fVar1 = (local_40->NextItemData).LineWeight;
          local_78.y = (double)(~-(ulong)(local_78.y <= 0.0) & (ulong)local_78.y);
          fVar2 = (local_40->NextItemData).DigitalBitHeight;
          fVar14 = (float)local_78.y * fVar2;
          local_64 = (int)fVar14;
          local_94 = (int)((float)(-(uint)(fVar14 <= fVar2) & (uint)fVar2 |
                                  ~-(uint)(fVar14 <= fVar2) & (uint)fVar14) +
                          (local_40->NextItemData).DigitalBitGap);
          if (local_94 < iVar8) {
            local_94 = iVar8;
          }
          local_a0 = PlotToPixels(&local_78,-1);
          IVar13 = PlotToPixels(&local_88,-1);
          local_a0.y = (float)(-0x14 - local_90->DigitalPlotOffset) + (local_60->Min).y;
          local_a8.x = IVar13.x;
          local_a8.y = (float)(-0x14 - ((int)fVar1 + local_90->DigitalPlotOffset + local_64)) +
                       (local_60->Min).y;
          iVar9 = iVar11 + 2;
          iVar8 = local_94;
          uVar10 = local_48;
          while (local_94 = iVar8, local_48 = uVar10, iVar9 < getter.Count) {
            if ((local_78.y != local_88.y) || (NAN(local_78.y) || NAN(local_88.y))) break;
            lVar7 = ((((int)local_38 + iVar11) % getter.Count + getter.Count) % getter.Count) *
                    lVar12;
            local_88.x = (double)(int)getter.Xs[lVar7];
            local_88.y = (double)(int)getter.Ys[lVar7];
            IVar13 = PlotToPixels(&local_88,-1);
            local_a8.x = IVar13.x;
            iVar9 = iVar11 + 3;
            iVar11 = iVar11 + 1;
            iVar8 = local_94;
            uVar10 = local_48;
          }
          fVar1 = (local_60->Min).x;
          if (local_a0.x < fVar1) {
            local_a0.x = fVar1;
          }
          fVar1 = (local_60->Min).x;
          if (local_a8.x < fVar1) {
            local_a8.x = fVar1;
          }
          fVar1 = (local_60->Max).x;
          if (fVar1 < local_a0.x) {
            local_a0.x = fVar1;
          }
          fVar1 = (local_60->Max).x;
          if (fVar1 < local_a8.x) {
            local_a8.x = fVar1;
          }
          if (local_a0.x < local_a8.x) {
            pIVar3 = local_90->CurrentPlot;
            fVar1 = (pIVar3->PlotRect).Min.x;
            if (((((fVar1 <= local_a0.x) && ((pIVar3->PlotRect).Min.y <= local_a0.y)) &&
                 (local_a0.x < (pIVar3->PlotRect).Max.x)) && (local_a0.y < (pIVar3->PlotRect).Max.y)
                ) || (((fVar1 <= local_a8.x && ((pIVar3->PlotRect).Min.y <= local_a8.y)) &&
                      ((local_a8.x < (pIVar3->PlotRect).Max.x &&
                       (local_a8.y < (pIVar3->PlotRect).Max.y)))))) {
              col = ImGui::GetColorU32(local_58);
              ImDrawList::AddRectFilled(local_50,&local_a0,&local_a8,col,0.0,0xf);
              iVar8 = local_94;
            }
          }
        }
        iVar11 = iVar11 + 1;
        local_78.x = local_88.x;
        local_78.y = local_88.y;
      } while (iVar11 < getter.Count);
      local_90->DigitalPlotItemCnt = local_90->DigitalPlotItemCnt + 1;
      local_90->DigitalPlotOffset = local_90->DigitalPlotOffset + iVar8;
    }
    pIVar4 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar4->NextItemData);
    pIVar4->PreviousItem = pIVar4->CurrentItem;
    pIVar4->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotDigitalEx(const char* label_id, Getter getter) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        ImPlotContext& gp = *GImPlot;
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImPlotNextItemData& s = GetItemData();
        if (getter.Count > 1 && s.RenderFill) {
            const int y_axis = GetCurrentYAxis();
            int pixYMax = 0;
            ImPlotPoint itemData1 = getter(0);
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint itemData2 = getter(i);
                if (ImNanOrInf(itemData1.y)) {
                    itemData1 = itemData2;
                    continue;
                }
                if (ImNanOrInf(itemData2.y)) itemData2.y = ImConstrainNan(ImConstrainInf(itemData2.y));
                int pixY_0 = (int)(s.LineWeight);
                itemData1.y = ImMax(0.0, itemData1.y);
                float pixY_1_float = s.DigitalBitHeight * (float)itemData1.y;
                int pixY_1 = (int)(pixY_1_float); //allow only positive values
                int pixY_chPosOffset = (int)(ImMax(s.DigitalBitHeight, pixY_1_float) + s.DigitalBitGap);
                pixYMax = ImMax(pixYMax, pixY_chPosOffset);
                ImVec2 pMin = PlotToPixels(itemData1);
                ImVec2 pMax = PlotToPixels(itemData2);
                int pixY_Offset = 20; //20 pixel from bottom due to mouse cursor label
                pMin.y = (gp.PixelRange[y_axis].Min.y) + ((-gp.DigitalPlotOffset)                   - pixY_Offset);
                pMax.y = (gp.PixelRange[y_axis].Min.y) + ((-gp.DigitalPlotOffset) - pixY_0 - pixY_1 - pixY_Offset);
                //plot only one rectangle for same digital state
                while (((i+2) < getter.Count) && (itemData1.y == itemData2.y)) {
                    const int in = (i + 1);
                    itemData2 = getter(in);
                    if (ImNanOrInf(itemData2.y)) break;
                    pMax.x = PlotToPixels(itemData2).x;
                    i++;
                }
                //do not extend plot outside plot range
                if (pMin.x < gp.PixelRange[y_axis].Min.x) pMin.x = gp.PixelRange[y_axis].Min.x;
                if (pMax.x < gp.PixelRange[y_axis].Min.x) pMax.x = gp.PixelRange[y_axis].Min.x;
                if (pMin.x > gp.PixelRange[y_axis].Max.x) pMin.x = gp.PixelRange[y_axis].Max.x;
                if (pMax.x > gp.PixelRange[y_axis].Max.x) pMax.x = gp.PixelRange[y_axis].Max.x;
                //plot a rectangle that extends up to x2 with y1 height
                if ((pMax.x > pMin.x) && (gp.CurrentPlot->PlotRect.Contains(pMin) || gp.CurrentPlot->PlotRect.Contains(pMax))) {
                    // ImVec4 colAlpha = item->Color;
                    // colAlpha.w = item->Highlight ? 1.0f : 0.9f;
                    DrawList.AddRectFilled(pMin, pMax, ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]));
                }
                itemData1 = itemData2;
            }
            gp.DigitalPlotItemCnt++;
            gp.DigitalPlotOffset += pixYMax;
        }
        EndItem();
    }
}